

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::StringMaker<std::vector<int,_std::allocator<int>_>_>::convert
                   (String *__return_storage_ptr__,vector<int,_std::allocator<int>_> *in)

{
  ostream *this;
  int *piVar1;
  ostringstream oss;
  anon_union_24_2_13149d16_for_String_2 local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
  piVar1 = (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar1 != (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish) {
    do {
      this = detail::getTlsOss();
      std::ostream::operator<<(this,*piVar1);
      detail::getTlsOssResult();
      operator<<((ostream *)local_1a8,(String *)&local_1c8.data);
      piVar1 = piVar1 + 1;
      String::~String((String *)&local_1c8.data);
      if (piVar1 != (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
    } while (piVar1 != (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
  std::__cxx11::stringbuf::str();
  String::String(__return_storage_ptr__,local_1c8.data.ptr);
  if (local_1c8.data.ptr != local_1c8.buf + 0x10) {
    operator_delete(local_1c8.data.ptr,local_1c8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static String convert(const std::vector<T>& in)
  {
    std::ostringstream oss;

    oss << "[";
    for (auto it = in.begin(); it != in.end();)
    {
      oss << StringMaker<T>::convert(*it++);
      if (it != in.end()) { oss << ", "; }
    }
    oss << "]";

    return oss.str().c_str();
  }